

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.hpp
# Opt level: O0

vector<int_*,_std::allocator<int_*>_> * __thiscall
kdtree::
KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
::queryRectangle(vector<int_*,_std::allocator<int_*>_> *__return_storage_ptr__,
                KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
                *this,int *searchMin,int *searchMax)

{
  bool bVar1;
  default_less<int> local_2d;
  int zeroDepth;
  int *piStack_28;
  int d;
  int *searchMax_local;
  int *searchMin_local;
  KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
  *this_local;
  
  zeroDepth = 0;
  piStack_28 = searchMax;
  searchMax_local = searchMin;
  searchMin_local = (int *)this;
  this_local = (KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
                *)__return_storage_ptr__;
  while( true ) {
    if (4 < (uint)zeroDepth) {
      if (this->root == (Node *)0x0) {
        memset(__return_storage_ptr__,0,0x18);
        std::vector<int_*,_std::allocator<int_*>_>::vector(__return_storage_ptr__);
      }
      else {
        queryRectangle(__return_storage_ptr__,this,this->root,searchMax_local,piStack_28,
                       this->boundingBoxMin,this->boundingBoxMax,0);
      }
      return __return_storage_ptr__;
    }
    bVar1 = default_less<int>::operator()(&local_2d,piStack_28,searchMax_local,zeroDepth);
    if (bVar1) break;
    zeroDepth = zeroDepth + 1;
  }
  memset(__return_storage_ptr__,0,0x18);
  std::vector<int_*,_std::allocator<int_*>_>::vector(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T*> queryRectangle(T* searchMin, T* searchMax) {
			for (int d = 0; d < dim; d++) {
				if (LESS()(searchMax, searchMin, d)) {
					return std::vector<T*>();
				}
			}

			if (root == nullptr) {
				return std::vector<T*>();
			}

			const int zeroDepth = 0;
			return queryRectangle(root, searchMin, searchMax, boundingBoxMin, boundingBoxMax, zeroDepth);
		}